

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.cpp
# Opt level: O2

void __thiscall libtorrent::digest32<256L>::stream_out(digest32<256L> *this,ostream *os)

{
  difference_type in_RCX;
  span<const_char> in;
  string local_30;
  
  in.m_len = in_RCX;
  in.m_ptr = (char *)0x20;
  aux::to_hex_abi_cxx11_(&local_30,(aux *)this,in);
  ::std::operator<<(os,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void digest32<N>::stream_out(std::ostream& os) const
	{
		os << aux::to_hex(*this);
	}